

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGear.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsGear::ArchiveIN(ChShaftsGear *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsGear>(marchive);
  ChShaftsCouple::ArchiveIN(&this->super_ChShaftsCouple,marchive);
  local_30._value = &this->ratio;
  local_30._name = "ratio";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->avoid_phase_drift;
  local_48._name = "avoid_phase_drift";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->phase1;
  local_60._name = "phase1";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->phase2;
  local_78._name = "phase2";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChShaftsGear::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsGear>();

    // deserialize parent class:
    ChShaftsCouple::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(ratio);
    marchive >> CHNVP(avoid_phase_drift);
    marchive >> CHNVP(phase1);
    marchive >> CHNVP(phase2);
}